

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O3

void __thiscall net_uv::Buffer::add(Buffer *this,char *pData,uint32_t dataLen)

{
  uint uVar1;
  uint uVar2;
  block *pbVar3;
  char *pcVar4;
  uint uVar5;
  block *pbVar6;
  char *curData;
  
  if (dataLen != 0) {
    pbVar6 = this->m_tailBlock;
    uVar5 = pbVar6->dataLen;
    do {
      uVar1 = this->m_blockSize;
      if (uVar5 < uVar1) {
        pcVar4 = pbVar6->data;
      }
      else {
        pbVar3 = (block *)malloc(0x20);
        pbVar3->dataLen = 0;
        pbVar3->next = (block *)0x0;
        pcVar4 = (char *)malloc((ulong)uVar1);
        pbVar3->data = pcVar4;
        pbVar6->next = pbVar3;
        pbVar3->pre = pbVar6;
        this->m_tailBlock = pbVar3;
        uVar5 = 0;
      }
      uVar2 = uVar1 - uVar5;
      if (dataLen <= uVar1 - uVar5) {
        uVar2 = dataLen;
      }
      memcpy(pcVar4 + uVar5,pData,(ulong)uVar2);
      pbVar6 = this->m_tailBlock;
      uVar5 = pbVar6->dataLen + uVar2;
      pbVar6->dataLen = uVar5;
      this->m_curDataLength = this->m_curDataLength + uVar2;
      pData = pData + uVar2;
      dataLen = dataLen - uVar2;
    } while (dataLen != 0);
  }
  return;
}

Assistant:

void add(char* pData, uint32_t dataLen)
	{
		char* curData = pData;
		while (dataLen > 0)
		{
			// create a new node
			if (m_tailBlock->dataLen >= m_blockSize)
			{
				block* b = createBlock();
				m_tailBlock->next = b;
				b->pre = m_tailBlock;
				m_tailBlock = b;
			}
			uint32_t sub = m_blockSize - m_tailBlock->dataLen;
			uint32_t copylen = (sub > dataLen) ? dataLen : sub;

			memcpy(m_tailBlock->data + m_tailBlock->dataLen, curData, copylen);

			m_tailBlock->dataLen += copylen;
			m_curDataLength += copylen;
			curData = curData + copylen;
			dataLen -= copylen;
		}
	}